

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluPrintConfig(int nVars,If_Grp_t *g,If_Grp_t *r,word BStruth,word *pFStruth)

{
  word wVar1;
  word *pFStruth_local;
  word BStruth_local;
  If_Grp_t *r_local;
  If_Grp_t *g_local;
  int nVars_local;
  
  pFStruth_local = (word *)BStruth;
  BStruth_local = (word)r;
  r_local = g;
  g_local._4_4_ = nVars;
  if ((int)r->nVars == (nVars - g->nVars) + 1 + (uint)('\x02' < g->nMyu)) {
    If_CluPrintGroup(g);
    if (r_local->nVars < '\x06') {
      pFStruth_local = (word *)If_CluAdjust((word)pFStruth_local,(int)r_local->nVars);
    }
    Kit_DsdPrintFromTruth((uint *)&pFStruth_local,(int)r_local->nVars);
    printf("\n");
    If_CluPrintGroup((If_Grp_t *)BStruth_local);
    if (*(char *)BStruth_local < '\x06') {
      wVar1 = If_CluAdjust(*pFStruth,(int)*(char *)BStruth_local);
      *pFStruth = wVar1;
    }
    Kit_DsdPrintFromTruth((uint *)pFStruth,(int)*(char *)BStruth_local);
    printf("\n");
    return;
  }
  __assert_fail("r->nVars == nVars - g->nVars + 1 + (g->nMyu > 2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x250,"void If_CluPrintConfig(int, If_Grp_t *, If_Grp_t *, word, word *)");
}

Assistant:

void If_CluPrintConfig( int nVars, If_Grp_t * g, If_Grp_t * r, word BStruth, word * pFStruth )
{
    assert( r->nVars == nVars - g->nVars + 1 + (g->nMyu > 2) );
    If_CluPrintGroup( g );
    if ( g->nVars < 6 )
        BStruth = If_CluAdjust( BStruth, g->nVars );
    Kit_DsdPrintFromTruth( (unsigned *)&BStruth, g->nVars );
    printf( "\n" );
    If_CluPrintGroup( r );
    if ( r->nVars < 6 )
        pFStruth[0] = If_CluAdjust( pFStruth[0], r->nVars );
    Kit_DsdPrintFromTruth( (unsigned *)pFStruth, r->nVars );
    printf( "\n" );
}